

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

s32 __thiscall
irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles
          (CNullDriver *this,path *vertexShaderProgramFileName,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,path *pixelShaderProgramFileName,
          c8 *pixelShaderEntryPointName,E_PIXEL_SHADER_TYPE psCompileTarget,
          path *geometryShaderProgramFileName,c8 *geometryShaderEntryPointName,
          E_GEOMETRY_SHADER_TYPE gsCompileTarget,E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,
          u32 verticesOut,IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,
          s32 userData)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  long *plVar4;
  double __x;
  double __x_00;
  double __x_01;
  long *plVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((int)(vertexShaderProgramFileName->str)._M_string_length == 0) {
LAB_001ed762:
    plVar2 = (long *)0x0;
  }
  else {
    iVar1 = (**this->FileSystem->_vptr_IFileSystem)();
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar2 == (long *)0x0) {
      os::Printer::log(__x);
      goto LAB_001ed762;
    }
  }
  if ((int)(pixelShaderProgramFileName->str)._M_string_length == 0) {
LAB_001ed79a:
    plVar3 = (long *)0x0;
  }
  else {
    iVar1 = (**this->FileSystem->_vptr_IFileSystem)(this->FileSystem,pixelShaderProgramFileName);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
    if (plVar3 == (long *)0x0) {
      os::Printer::log(__x_00);
      goto LAB_001ed79a;
    }
  }
  if ((int)(geometryShaderProgramFileName->str)._M_string_length != 0) {
    iVar1 = (**this->FileSystem->_vptr_IFileSystem)(this->FileSystem,geometryShaderProgramFileName);
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar1);
    if (plVar4 != (long *)0x0) goto LAB_001ed7ef;
    os::Printer::log(__x_01);
  }
  plVar4 = (long *)0x0;
LAB_001ed7ef:
  iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x73])
                    (this,plVar2,vertexShaderEntryPointName,(ulong)vsCompileTarget,plVar3,
                     pixelShaderEntryPointName,(ulong)psCompileTarget,plVar4,
                     geometryShaderEntryPointName,(ulong)gsCompileTarget,(ulong)inType,
                     (ulong)outType,(ulong)verticesOut,callback,(ulong)baseMaterial,
                     (ulong)(uint)userData);
  if (plVar3 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  }
  if (plVar2 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  if (plVar4 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  }
  return iVar1;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		const io::path &vertexShaderProgramFileName,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const io::path &pixelShaderProgramFileName,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const io::path &geometryShaderProgramFileName,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	io::IReadFile *vsfile = 0;
	io::IReadFile *psfile = 0;
	io::IReadFile *gsfile = 0;

	if (vertexShaderProgramFileName.size()) {
		vsfile = FileSystem->createAndOpenFile(vertexShaderProgramFileName);
		if (!vsfile) {
			os::Printer::log("Could not open vertex shader program file",
					vertexShaderProgramFileName, ELL_WARNING);
		}
	}

	if (pixelShaderProgramFileName.size()) {
		psfile = FileSystem->createAndOpenFile(pixelShaderProgramFileName);
		if (!psfile) {
			os::Printer::log("Could not open pixel shader program file",
					pixelShaderProgramFileName, ELL_WARNING);
		}
	}

	if (geometryShaderProgramFileName.size()) {
		gsfile = FileSystem->createAndOpenFile(geometryShaderProgramFileName);
		if (!gsfile) {
			os::Printer::log("Could not open geometry shader program file",
					geometryShaderProgramFileName, ELL_WARNING);
		}
	}

	s32 result = addHighLevelShaderMaterialFromFiles(
			vsfile, vertexShaderEntryPointName, vsCompileTarget,
			psfile, pixelShaderEntryPointName, psCompileTarget,
			gsfile, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	if (psfile)
		psfile->drop();

	if (vsfile)
		vsfile->drop();

	if (gsfile)
		gsfile->drop();

	return result;
}